

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

uint16 google::protobuf::internal::EndianHelper<2>::Load(void *p)

{
  uint16 tmp;
  void *p_local;
  
  return *p;
}

Assistant:

static uint16 Load(const void* p) {
    uint16 tmp;
    std::memcpy(&tmp, p, 2);
#ifndef PROTOBUF_LITTLE_ENDIAN
    tmp = bswap_16(tmp);
#endif
    return tmp;
  }